

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<int>_>::RegularLink
          (RegularLink<diy::Bounds<int>_> *this,int dim,Bounds *core__,Bounds *bounds__)

{
  type in_ESI;
  Bounds<int> *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<int>_>_> *in_stack_ffffffffffffffb0;
  Bounds<int> *pBVar1;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<int>_>_>::Registrar
            (in_stack_ffffffffffffffb0);
  *(undefined ***)&(in_RDI->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_> =
       &PTR_id_abi_cxx11__0014bab0;
  (in_RDI->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_static_data[0] = in_ESI;
  std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x134d6a);
  pBVar1 = (Bounds<int> *)
           &(in_RDI->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity;
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x134d7d);
  Bounds<int>::Bounds(in_RDI,pBVar1);
  Bounds<int>::Bounds(in_RDI,pBVar1);
  std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::vector
            ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)0x134dc0);
  std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::vector
            ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)0x134dd1);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x134de2);
  return;
}

Assistant:

RegularLink(int dim, const Bounds& core__, const Bounds& bounds__):
                  dim_(dim), core_(core__), bounds_(bounds__) {}